

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O1

void ga_sort_scat(Integer *pn,void *v,Integer *i,Integer *j,Integer *base,Integer type)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  int iVar4;
  undefined8 uVar5;
  Integer IVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long *plVar12;
  long *plVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Integer *pIVar17;
  long lVar18;
  long *plVar19;
  DoubleComplex dtmp;
  
  switch(type) {
  case 0x3e9:
    uVar15 = *pn;
    if (1 < (long)uVar15) {
      uVar14 = uVar15 >> 1;
      lVar9 = uVar15 * 8 + -8;
      if (uVar14 != 1) {
        do {
          plVar13 = base + (uVar14 - 1);
          uVar16 = uVar14;
          for (plVar12 = base + (uVar14 - 1) + uVar14; plVar12 <= base + (uVar15 - 1);
              plVar12 = plVar12 + uVar16) {
            uVar16 = uVar16 * 2;
            if (plVar12 != base + (uVar15 - 1)) {
              plVar19 = plVar12 + 1;
              lVar10 = *plVar12;
              if (lVar10 < *plVar19) {
                plVar12 = plVar12 + 1;
              }
              uVar16 = uVar16 | lVar10 < *plVar19;
            }
            lVar10 = *plVar13;
            if (*plVar12 <= lVar10) break;
            lVar18 = (long)plVar12 - (long)base;
            *plVar13 = *plVar12;
            lVar11 = (long)plVar13 - (long)base;
            *plVar12 = (long)(int)lVar10;
            uVar3 = *(undefined4 *)((long)v + (lVar11 >> 1));
            *(undefined4 *)((long)v + (lVar11 >> 1)) = *(undefined4 *)((long)v + (lVar18 >> 1));
            *(undefined4 *)((long)v + (lVar18 >> 1)) = uVar3;
            iVar4 = *(int *)((long)i + lVar11);
            *(undefined8 *)((long)i + lVar11) = *(undefined8 *)((long)i + lVar18);
            *(long *)((long)i + lVar18) = (long)iVar4;
            iVar4 = *(int *)((long)j + lVar11);
            *(undefined8 *)((long)j + lVar11) = *(undefined8 *)((long)j + lVar18);
            *(long *)((long)j + lVar18) = (long)iVar4;
            plVar13 = plVar12;
          }
          uVar14 = uVar14 - 1;
        } while (uVar14 != 1);
      }
      if (lVar9 != 0) {
        do {
          if (7 < lVar9) {
            uVar15 = 1;
            pIVar17 = base;
            plVar13 = base + 1;
            do {
              uVar15 = uVar15 * 2;
              plVar12 = plVar13;
              if (plVar13 != (long *)((long)base + lVar9)) {
                plVar12 = plVar13 + 1;
                lVar10 = *plVar13;
                if (lVar10 < *plVar12) {
                  plVar13 = plVar13 + 1;
                }
                uVar15 = uVar15 | lVar10 < *plVar12;
                plVar12 = plVar13;
              }
              lVar10 = *pIVar17;
              if (*plVar12 <= lVar10) break;
              lVar18 = (long)plVar12 - (long)base;
              *pIVar17 = *plVar12;
              lVar11 = (long)pIVar17 - (long)base;
              *plVar12 = (long)(int)lVar10;
              uVar3 = *(undefined4 *)((long)v + (lVar11 >> 1));
              *(undefined4 *)((long)v + (lVar11 >> 1)) = *(undefined4 *)((long)v + (lVar18 >> 1));
              *(undefined4 *)((long)v + (lVar18 >> 1)) = uVar3;
              iVar4 = *(int *)((long)i + lVar11);
              *(undefined8 *)((long)i + lVar11) = *(undefined8 *)((long)i + lVar18);
              *(long *)((long)i + lVar18) = (long)iVar4;
              iVar4 = *(int *)((long)j + lVar11);
              *(undefined8 *)((long)j + lVar11) = *(undefined8 *)((long)j + lVar18);
              *(long *)((long)j + lVar18) = (long)iVar4;
              plVar13 = plVar12 + uVar15;
              pIVar17 = plVar12;
            } while (plVar13 <= (long *)((long)base + lVar9));
          }
          IVar6 = *base;
          *base = *(Integer *)((long)base + lVar9);
          *(long *)((long)base + lVar9) = (long)(int)IVar6;
          uVar3 = *v;
          *(undefined4 *)v = *(undefined4 *)((long)v + (lVar9 >> 1));
          *(undefined4 *)((long)v + (lVar9 >> 1)) = uVar3;
          IVar6 = *i;
          *i = *(Integer *)((long)i + lVar9);
          *(long *)((long)i + lVar9) = (long)(int)IVar6;
          IVar6 = *j;
          *j = *(Integer *)((long)j + lVar9);
          *(long *)((long)j + lVar9) = (long)(int)IVar6;
          lVar9 = lVar9 + -8;
        } while (lVar9 != 0);
      }
    }
    break;
  case 0x3ea:
    uVar15 = *pn;
    if (1 < (long)uVar15) {
      uVar14 = uVar15 >> 1;
      lVar9 = uVar15 * 8 + -8;
      if (uVar14 != 1) {
        do {
          plVar13 = base + (uVar14 - 1);
          uVar16 = uVar14;
          for (plVar12 = base + (uVar14 - 1) + uVar14; plVar12 <= base + (uVar15 - 1);
              plVar12 = plVar12 + uVar16) {
            uVar16 = uVar16 * 2;
            if (plVar12 != base + (uVar15 - 1)) {
              plVar19 = plVar12 + 1;
              if (plVar12[1] <= *plVar12) {
                plVar19 = plVar12;
              }
              uVar16 = uVar16 | *plVar12 < plVar12[1];
              plVar12 = plVar19;
            }
            lVar10 = *plVar13;
            if (*plVar12 <= lVar10) break;
            lVar18 = (long)plVar12 - (long)base;
            *plVar13 = *plVar12;
            lVar11 = (long)plVar13 - (long)base;
            *plVar12 = lVar10;
            uVar5 = *(undefined8 *)((long)v + lVar11);
            *(undefined8 *)((long)v + lVar11) = *(undefined8 *)((long)v + lVar18);
            *(undefined8 *)((long)v + lVar18) = uVar5;
            uVar5 = *(undefined8 *)((long)i + lVar11);
            *(undefined8 *)((long)i + lVar11) = *(undefined8 *)((long)i + lVar18);
            *(undefined8 *)((long)i + lVar18) = uVar5;
            uVar5 = *(undefined8 *)((long)j + lVar11);
            *(undefined8 *)((long)j + lVar11) = *(undefined8 *)((long)j + lVar18);
            *(undefined8 *)((long)j + lVar18) = uVar5;
            plVar13 = plVar12;
          }
          uVar14 = uVar14 - 1;
        } while (uVar14 != 1);
      }
      if (lVar9 != 0) {
        do {
          if (7 < lVar9) {
            uVar15 = 1;
            pIVar17 = base;
            plVar13 = base + 1;
            do {
              uVar15 = uVar15 * 2;
              if (plVar13 != (long *)((long)base + lVar9)) {
                plVar12 = plVar13 + 1;
                if (plVar13[1] <= *plVar13) {
                  plVar12 = plVar13;
                }
                uVar15 = uVar15 | *plVar13 < plVar13[1];
                plVar13 = plVar12;
              }
              lVar10 = *pIVar17;
              if (*plVar13 <= lVar10) break;
              lVar18 = (long)plVar13 - (long)base;
              *pIVar17 = *plVar13;
              lVar11 = (long)pIVar17 - (long)base;
              *plVar13 = lVar10;
              uVar5 = *(undefined8 *)((long)v + lVar11);
              *(undefined8 *)((long)v + lVar11) = *(undefined8 *)((long)v + lVar18);
              *(undefined8 *)((long)v + lVar18) = uVar5;
              uVar5 = *(undefined8 *)((long)i + lVar11);
              *(undefined8 *)((long)i + lVar11) = *(undefined8 *)((long)i + lVar18);
              *(undefined8 *)((long)i + lVar18) = uVar5;
              uVar5 = *(undefined8 *)((long)j + lVar11);
              *(undefined8 *)((long)j + lVar11) = *(undefined8 *)((long)j + lVar18);
              *(undefined8 *)((long)j + lVar18) = uVar5;
              plVar12 = plVar13 + uVar15;
              pIVar17 = plVar13;
              plVar13 = plVar12;
            } while (plVar12 <= (long *)((long)base + lVar9));
          }
          IVar6 = *base;
          *base = *(Integer *)((long)base + lVar9);
          *(Integer *)((long)base + lVar9) = IVar6;
          uVar5 = *v;
          *(undefined8 *)v = *(undefined8 *)((long)v + lVar9);
          *(undefined8 *)((long)v + lVar9) = uVar5;
          IVar6 = *i;
          *i = *(Integer *)((long)i + lVar9);
          *(Integer *)((long)i + lVar9) = IVar6;
          IVar6 = *j;
          *j = *(Integer *)((long)j + lVar9);
          *(Integer *)((long)j + lVar9) = IVar6;
          lVar9 = lVar9 + -8;
        } while (lVar9 != 0);
      }
    }
    break;
  case 0x3eb:
    uVar15 = *pn;
    if (1 < (long)uVar15) {
      uVar14 = uVar15 >> 1;
      lVar9 = uVar15 * 8 + -8;
      if (uVar14 != 1) {
        do {
          plVar13 = base + (uVar14 - 1);
          uVar16 = uVar14;
          for (plVar12 = base + (uVar14 - 1) + uVar14; plVar12 <= base + (uVar15 - 1);
              plVar12 = plVar12 + uVar16) {
            uVar16 = uVar16 * 2;
            if (plVar12 != base + (uVar15 - 1)) {
              plVar19 = plVar12 + 1;
              lVar10 = *plVar12;
              if (lVar10 < *plVar19) {
                plVar12 = plVar12 + 1;
              }
              uVar16 = uVar16 | lVar10 < *plVar19;
            }
            lVar10 = *plVar13;
            if (*plVar12 <= lVar10) break;
            *plVar13 = *plVar12;
            *plVar12 = lVar10;
            lVar10 = (long)(int)((ulong)((long)plVar13 - (long)base) >> 3);
            uVar3 = *(undefined4 *)((long)v + lVar10 * 4);
            lVar11 = (long)(int)((ulong)((long)plVar12 - (long)base) >> 3);
            *(undefined4 *)((long)v + lVar10 * 4) = *(undefined4 *)((long)v + lVar11 * 4);
            *(undefined4 *)((long)v + lVar11 * 4) = uVar3;
            IVar6 = i[lVar10];
            i[lVar10] = i[lVar11];
            i[lVar11] = IVar6;
            IVar6 = j[lVar10];
            j[lVar10] = j[lVar11];
            j[lVar11] = IVar6;
            plVar13 = plVar12;
          }
          uVar14 = uVar14 - 1;
        } while (uVar14 != 1);
      }
      if (lVar9 != 0) {
        do {
          if (7 < lVar9) {
            uVar15 = 1;
            pIVar17 = base;
            plVar13 = base + 1;
            do {
              uVar15 = uVar15 * 2;
              plVar12 = plVar13;
              if (plVar13 != (long *)((long)base + lVar9)) {
                plVar12 = plVar13 + 1;
                lVar10 = *plVar13;
                if (lVar10 < *plVar12) {
                  plVar13 = plVar13 + 1;
                }
                uVar15 = uVar15 | lVar10 < *plVar12;
                plVar12 = plVar13;
              }
              lVar10 = *pIVar17;
              if (*plVar12 <= lVar10) break;
              *pIVar17 = *plVar12;
              *plVar12 = lVar10;
              lVar10 = (long)(int)((ulong)((long)pIVar17 - (long)base) >> 3);
              uVar3 = *(undefined4 *)((long)v + lVar10 * 4);
              lVar11 = (long)(int)((ulong)((long)plVar12 - (long)base) >> 3);
              *(undefined4 *)((long)v + lVar10 * 4) = *(undefined4 *)((long)v + lVar11 * 4);
              *(undefined4 *)((long)v + lVar11 * 4) = uVar3;
              IVar6 = i[lVar10];
              i[lVar10] = i[lVar11];
              i[lVar11] = IVar6;
              IVar6 = j[lVar10];
              j[lVar10] = j[lVar11];
              j[lVar11] = IVar6;
              plVar13 = plVar12 + uVar15;
              pIVar17 = plVar12;
            } while (plVar13 <= (long *)((long)base + lVar9));
          }
          IVar6 = *base;
          *base = *(Integer *)((long)base + lVar9);
          *(Integer *)((long)base + lVar9) = IVar6;
          uVar3 = *v;
          lVar10 = (lVar9 << 0x1d) >> 0x1e;
          *(undefined4 *)v = *(undefined4 *)((long)v + lVar10);
          *(undefined4 *)((long)v + lVar10) = uVar3;
          IVar6 = *i;
          lVar10 = (lVar9 << 0x1d) >> 0x1d;
          *i = *(Integer *)((long)i + lVar10);
          *(Integer *)((long)i + lVar10) = IVar6;
          IVar6 = *j;
          *j = *(Integer *)((long)j + lVar10);
          *(Integer *)((long)j + lVar10) = IVar6;
          lVar9 = lVar9 + -8;
        } while (lVar9 != 0);
      }
    }
    break;
  case 0x3ec:
    uVar15 = *pn;
    if (1 < (long)uVar15) {
      uVar14 = uVar15 >> 1;
      lVar9 = uVar15 * 8 + -8;
      if (uVar14 != 1) {
        do {
          plVar13 = base + (uVar14 - 1);
          uVar16 = uVar14;
          for (plVar12 = base + (uVar14 - 1) + uVar14; plVar12 <= base + (uVar15 - 1);
              plVar12 = plVar12 + uVar16) {
            uVar16 = uVar16 * 2;
            if (plVar12 != base + (uVar15 - 1)) {
              plVar19 = plVar12 + 1;
              lVar10 = *plVar12;
              if (lVar10 < *plVar19) {
                plVar12 = plVar12 + 1;
              }
              uVar16 = uVar16 | lVar10 < *plVar19;
            }
            lVar10 = *plVar13;
            if (*plVar12 <= lVar10) break;
            lVar18 = (long)plVar12 - (long)base;
            *plVar13 = *plVar12;
            lVar11 = (long)plVar13 - (long)base;
            *plVar12 = lVar10;
            uVar5 = *(undefined8 *)((long)v + lVar11);
            *(undefined8 *)((long)v + lVar11) = *(undefined8 *)((long)v + lVar18);
            *(undefined8 *)((long)v + lVar18) = uVar5;
            uVar5 = *(undefined8 *)((long)i + lVar11);
            *(undefined8 *)((long)i + lVar11) = *(undefined8 *)((long)i + lVar18);
            *(undefined8 *)((long)i + lVar18) = uVar5;
            uVar5 = *(undefined8 *)((long)j + lVar11);
            *(undefined8 *)((long)j + lVar11) = *(undefined8 *)((long)j + lVar18);
            *(undefined8 *)((long)j + lVar18) = uVar5;
            plVar13 = plVar12;
          }
          uVar14 = uVar14 - 1;
        } while (uVar14 != 1);
      }
      if (lVar9 != 0) {
        do {
          if (7 < lVar9) {
            uVar15 = 1;
            plVar13 = base + 1;
            pIVar17 = base;
            do {
              uVar15 = uVar15 * 2;
              plVar12 = plVar13;
              if (plVar13 != (long *)((long)base + lVar9)) {
                plVar12 = plVar13 + 1;
                lVar10 = *plVar13;
                if (lVar10 < *plVar12) {
                  plVar13 = plVar13 + 1;
                }
                uVar15 = uVar15 | lVar10 < *plVar12;
                plVar12 = plVar13;
              }
              lVar10 = *pIVar17;
              if (*plVar12 <= lVar10) break;
              lVar18 = (long)plVar12 - (long)base;
              *pIVar17 = *plVar12;
              lVar11 = (long)pIVar17 - (long)base;
              *plVar12 = lVar10;
              uVar5 = *(undefined8 *)((long)v + lVar11);
              *(undefined8 *)((long)v + lVar11) = *(undefined8 *)((long)v + lVar18);
              *(undefined8 *)((long)v + lVar18) = uVar5;
              uVar5 = *(undefined8 *)((long)i + lVar11);
              *(undefined8 *)((long)i + lVar11) = *(undefined8 *)((long)i + lVar18);
              *(undefined8 *)((long)i + lVar18) = uVar5;
              uVar5 = *(undefined8 *)((long)j + lVar11);
              *(undefined8 *)((long)j + lVar11) = *(undefined8 *)((long)j + lVar18);
              *(undefined8 *)((long)j + lVar18) = uVar5;
              plVar13 = plVar12 + uVar15;
              pIVar17 = plVar12;
            } while (plVar13 <= (long *)((long)base + lVar9));
          }
          IVar6 = *base;
          *base = *(Integer *)((long)base + lVar9);
          *(Integer *)((long)base + lVar9) = IVar6;
          uVar5 = *v;
          *(undefined8 *)v = *(undefined8 *)((long)v + lVar9);
          *(undefined8 *)((long)v + lVar9) = uVar5;
          IVar6 = *i;
          *i = *(Integer *)((long)i + lVar9);
          *(Integer *)((long)i + lVar9) = IVar6;
          IVar6 = *j;
          *j = *(Integer *)((long)j + lVar9);
          *(Integer *)((long)j + lVar9) = IVar6;
          lVar9 = lVar9 + -8;
        } while (lVar9 != 0);
      }
    }
    break;
  default:
    pnga_error("ERROR:ga_sort_scat: wrong type",type);
    return;
  case 0x3ee:
    uVar15 = *pn;
    if (1 < (long)uVar15) {
      uVar14 = uVar15 >> 1;
      lVar9 = uVar15 * 8 + -8;
      if (uVar14 != 1) {
        do {
          plVar13 = base + (uVar14 - 1);
          uVar16 = uVar14;
          for (plVar12 = base + (uVar14 - 1) + uVar14; plVar12 <= base + (uVar15 - 1);
              plVar12 = plVar12 + uVar16) {
            uVar16 = uVar16 * 2;
            if (plVar12 != base + (uVar15 - 1)) {
              plVar19 = plVar12 + 1;
              if (plVar12[1] <= *plVar12) {
                plVar19 = plVar12;
              }
              uVar16 = uVar16 | *plVar12 < plVar12[1];
              plVar12 = plVar19;
            }
            lVar10 = *plVar13;
            if (*plVar12 <= lVar10) break;
            lVar18 = (long)plVar12 - (long)base;
            *plVar13 = *plVar12;
            lVar11 = (long)plVar13 - (long)base;
            *plVar12 = lVar10;
            uVar5 = *(undefined8 *)((long)v + lVar11);
            *(undefined8 *)((long)v + lVar11) = *(undefined8 *)((long)v + lVar18);
            *(undefined8 *)((long)v + lVar18) = uVar5;
            uVar5 = *(undefined8 *)((long)i + lVar11);
            *(undefined8 *)((long)i + lVar11) = *(undefined8 *)((long)i + lVar18);
            *(undefined8 *)((long)i + lVar18) = uVar5;
            uVar5 = *(undefined8 *)((long)j + lVar11);
            *(undefined8 *)((long)j + lVar11) = *(undefined8 *)((long)j + lVar18);
            *(undefined8 *)((long)j + lVar18) = uVar5;
            plVar13 = plVar12;
          }
          uVar14 = uVar14 - 1;
        } while (uVar14 != 1);
      }
      if (lVar9 != 0) {
        do {
          if (7 < lVar9) {
            uVar15 = 1;
            pIVar17 = base;
            plVar13 = base + 1;
            do {
              uVar15 = uVar15 * 2;
              if (plVar13 != (long *)((long)base + lVar9)) {
                plVar12 = plVar13 + 1;
                if (plVar13[1] <= *plVar13) {
                  plVar12 = plVar13;
                }
                uVar15 = uVar15 | *plVar13 < plVar13[1];
                plVar13 = plVar12;
              }
              lVar10 = *pIVar17;
              if (*plVar13 <= lVar10) break;
              lVar18 = (long)plVar13 - (long)base;
              *pIVar17 = *plVar13;
              lVar11 = (long)pIVar17 - (long)base;
              *plVar13 = lVar10;
              uVar5 = *(undefined8 *)((long)v + lVar11);
              *(undefined8 *)((long)v + lVar11) = *(undefined8 *)((long)v + lVar18);
              *(undefined8 *)((long)v + lVar18) = uVar5;
              uVar5 = *(undefined8 *)((long)i + lVar11);
              *(undefined8 *)((long)i + lVar11) = *(undefined8 *)((long)i + lVar18);
              *(undefined8 *)((long)i + lVar18) = uVar5;
              uVar5 = *(undefined8 *)((long)j + lVar11);
              *(undefined8 *)((long)j + lVar11) = *(undefined8 *)((long)j + lVar18);
              *(undefined8 *)((long)j + lVar18) = uVar5;
              plVar12 = plVar13 + uVar15;
              pIVar17 = plVar13;
              plVar13 = plVar12;
            } while (plVar12 <= (long *)((long)base + lVar9));
          }
          IVar6 = *base;
          *base = *(Integer *)((long)base + lVar9);
          *(Integer *)((long)base + lVar9) = IVar6;
          uVar5 = *v;
          *(undefined8 *)v = *(undefined8 *)((long)v + lVar9);
          *(undefined8 *)((long)v + lVar9) = uVar5;
          IVar6 = *i;
          *i = *(Integer *)((long)i + lVar9);
          *(Integer *)((long)i + lVar9) = IVar6;
          IVar6 = *j;
          *j = *(Integer *)((long)j + lVar9);
          *(Integer *)((long)j + lVar9) = IVar6;
          lVar9 = lVar9 + -8;
        } while (lVar9 != 0);
      }
    }
    break;
  case 0x3ef:
    uVar15 = *pn;
    if (1 < (long)uVar15) {
      uVar14 = uVar15 >> 1;
      lVar9 = uVar15 * 8 + -8;
      if (uVar14 != 1) {
        do {
          plVar13 = base + (uVar14 - 1);
          uVar16 = uVar14;
          for (plVar12 = base + (uVar14 - 1) + uVar14; plVar12 <= base + (uVar15 - 1);
              plVar12 = plVar12 + uVar16) {
            uVar16 = uVar16 * 2;
            if (plVar12 != base + (uVar15 - 1)) {
              plVar19 = plVar12 + 1;
              lVar10 = *plVar12;
              if (lVar10 < *plVar19) {
                plVar12 = plVar12 + 1;
              }
              uVar16 = uVar16 | lVar10 < *plVar19;
            }
            if (*plVar12 <= *plVar13) break;
            lVar10 = *plVar13;
            *plVar13 = *plVar12;
            lVar11 = (long)plVar13 - (long)base;
            lVar18 = (long)plVar12 - (long)base;
            *plVar12 = lVar10;
            puVar1 = (undefined8 *)((long)v + lVar11 * 2);
            uVar5 = *puVar1;
            uVar7 = puVar1[1];
            puVar1 = (undefined8 *)((long)v + lVar18 * 2);
            uVar8 = puVar1[1];
            puVar2 = (undefined8 *)((long)v + lVar11 * 2);
            *puVar2 = *puVar1;
            puVar2[1] = uVar8;
            puVar1 = (undefined8 *)((long)v + lVar18 * 2);
            *puVar1 = uVar5;
            puVar1[1] = uVar7;
            uVar5 = *(undefined8 *)((long)i + lVar11);
            *(undefined8 *)((long)i + lVar11) = *(undefined8 *)((long)i + lVar18);
            *(undefined8 *)((long)i + lVar18) = uVar5;
            uVar5 = *(undefined8 *)((long)j + lVar11);
            *(undefined8 *)((long)j + lVar11) = *(undefined8 *)((long)j + lVar18);
            *(undefined8 *)((long)j + lVar18) = uVar5;
            plVar13 = plVar12;
          }
          uVar14 = uVar14 - 1;
        } while (uVar14 != 1);
      }
      if (lVar9 != 0) {
        do {
          if (7 < lVar9) {
            uVar15 = 1;
            pIVar17 = base;
            plVar13 = base + 1;
            do {
              uVar15 = uVar15 * 2;
              plVar12 = plVar13;
              if (plVar13 != (long *)((long)base + lVar9)) {
                plVar12 = plVar13 + 1;
                lVar10 = *plVar13;
                if (lVar10 < *plVar12) {
                  plVar13 = plVar13 + 1;
                }
                uVar15 = uVar15 | lVar10 < *plVar12;
                plVar12 = plVar13;
              }
              if (*plVar12 <= *pIVar17) break;
              lVar10 = *pIVar17;
              *pIVar17 = *plVar12;
              lVar11 = (long)pIVar17 - (long)base;
              lVar18 = (long)plVar12 - (long)base;
              *plVar12 = lVar10;
              puVar1 = (undefined8 *)((long)v + lVar11 * 2);
              uVar5 = *puVar1;
              uVar7 = puVar1[1];
              puVar1 = (undefined8 *)((long)v + lVar18 * 2);
              uVar8 = puVar1[1];
              puVar2 = (undefined8 *)((long)v + lVar11 * 2);
              *puVar2 = *puVar1;
              puVar2[1] = uVar8;
              puVar1 = (undefined8 *)((long)v + lVar18 * 2);
              *puVar1 = uVar5;
              puVar1[1] = uVar7;
              uVar5 = *(undefined8 *)((long)i + lVar11);
              *(undefined8 *)((long)i + lVar11) = *(undefined8 *)((long)i + lVar18);
              *(undefined8 *)((long)i + lVar18) = uVar5;
              uVar5 = *(undefined8 *)((long)j + lVar11);
              *(undefined8 *)((long)j + lVar11) = *(undefined8 *)((long)j + lVar18);
              *(undefined8 *)((long)j + lVar18) = uVar5;
              plVar13 = plVar12 + uVar15;
              pIVar17 = plVar12;
            } while (plVar13 <= (long *)((long)base + lVar9));
          }
          IVar6 = *base;
          *base = *(Integer *)((long)base + lVar9);
          *(Integer *)((long)base + lVar9) = IVar6;
          uVar5 = *v;
          uVar7 = *(undefined8 *)((long)v + 8);
          puVar1 = (undefined8 *)((long)v + lVar9 * 2);
          uVar8 = puVar1[1];
          *(undefined8 *)v = *puVar1;
          *(undefined8 *)((long)v + 8) = uVar8;
          puVar1 = (undefined8 *)((long)v + lVar9 * 2);
          *puVar1 = uVar5;
          puVar1[1] = uVar7;
          IVar6 = *i;
          *i = *(Integer *)((long)i + lVar9);
          *(Integer *)((long)i + lVar9) = IVar6;
          IVar6 = *j;
          *j = *(Integer *)((long)j + lVar9);
          *(Integer *)((long)j + lVar9) = IVar6;
          lVar9 = lVar9 + -8;
        } while (lVar9 != 0);
      }
    }
  }
  return;
}

Assistant:

void ga_sort_scat(pn, v, i, j, base, type)
     Integer *pn;
     void    *v;
     Integer *i;
     Integer *j;
     Integer *base;
     Integer type;
{ 
   switch (type){
     case C_DBL:  ga_sort_scat_dbl_(pn, (double*)v, i,j,base);break;
     case C_DCPL: ga_sort_scat_dcpl_(pn, (DoubleComplex*)v, i,j,base); break;
     case C_SCPL: ga_sort_scat_scpl_(pn, (SingleComplex*)v, i,j,base); break;
     case C_INT:  ga_sort_scat_int_(pn, (int*)v, i, j, base); break;
     case C_FLOAT:  ga_sort_scat_flt_(pn, (float*)v, i, j, base); break; 
     case C_LONG:  ga_sort_scat_long_(pn, (long*)v, i, j, base); break;
     default:        pnga_error("ERROR:ga_sort_scat: wrong type",type);
   } 
}